

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_test_overlap(int ndim,long *tfpixel,long *tlpixel,long *fpixel,long *lpixel,long *ininc,
                       int *status)

{
  long in_RCX;
  long lVar1;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int *in_stack_00000008;
  long imglpix [6];
  long imgfpix [6];
  long tiledim [6];
  long imgdim [6];
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  int local_15c;
  long alStack_158 [6];
  long alStack_128 [6];
  long alStack_f8 [6];
  long alStack_c8 [6];
  long alStack_98 [6];
  long tl;
  long tf;
  int ii;
  long inc [6];
  int local_4;
  
  if (*in_stack_00000008 < 1) {
    inc[4] = in_R9;
    inc[5] = in_R8;
    for (local_15c = 0; local_15c < in_EDI; local_15c = local_15c + 1) {
      if ((*(long *)(in_RDX + (long)local_15c * 8) < *(long *)(in_RCX + (long)local_15c * 8)) ||
         (*(long *)(inc[5] + (long)local_15c * 8) < *(long *)(in_RSI + (long)local_15c * 8))) {
        return 0;
      }
      alStack_158[local_15c] = *(long *)(inc[4] + (long)local_15c * 8);
      lVar1 = alStack_158[local_15c];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      (&tl)[local_15c] =
           (*(long *)(inc[5] + (long)local_15c * 8) - *(long *)(in_RCX + (long)local_15c * 8)) /
           lVar1 + 1;
      if ((&tl)[local_15c] < 1) {
        *in_stack_00000008 = 0x143;
        return 0;
      }
      alStack_98[local_15c] =
           (*(long *)(in_RDX + (long)local_15c * 8) - *(long *)(in_RSI + (long)local_15c * 8)) + 1;
      if (alStack_98[local_15c] < 1) {
        *in_stack_00000008 = 0x143;
        return 0;
      }
      if (0 < local_15c) {
        alStack_98[local_15c] = alStack_98[local_15c + -1] * alStack_98[local_15c];
      }
      local_168 = *(long *)(in_RSI + (long)local_15c * 8) + -1;
      local_170 = *(long *)(in_RDX + (long)local_15c * 8) + -1;
      while( true ) {
        lVar1 = alStack_158[local_15c];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if ((local_168 - (*(long *)(in_RCX + (long)local_15c * 8) + -1)) % lVar1 == 0) break;
        local_168 = local_168 + 1;
        if (local_170 < local_168) {
          return 0;
        }
      }
      while( true ) {
        lVar1 = alStack_158[local_15c];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if ((local_170 - (*(long *)(in_RCX + (long)local_15c * 8) + -1)) % lVar1 == 0) break;
        local_170 = local_170 + -1;
        if (local_170 < local_168) {
          return 0;
        }
      }
      lVar1 = alStack_158[local_15c];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      if (((local_168 - *(long *)(in_RCX + (long)local_15c * 8)) + 1) / lVar1 < 1) {
        local_178 = 0;
      }
      else {
        local_178 = alStack_158[local_15c];
        if (local_178 < 1) {
          local_178 = -local_178;
        }
        local_178 = ((local_168 - *(long *)(in_RCX + (long)local_15c * 8)) + 1) / local_178;
      }
      alStack_c8[local_15c] = local_178;
      lVar1 = alStack_158[local_15c];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      if (((local_170 - *(long *)(in_RCX + (long)local_15c * 8)) + 1) / lVar1 <
          (&tl)[local_15c] + -1) {
        local_180 = alStack_158[local_15c];
        if (local_180 < 1) {
          local_180 = -local_180;
        }
        local_180 = ((local_170 - *(long *)(in_RCX + (long)local_15c * 8)) + 1) / local_180;
      }
      else {
        local_180 = (&tl)[local_15c] + -1;
      }
      alStack_f8[local_15c] = local_180;
      if (*(long *)(in_RCX + (long)local_15c * 8) - *(long *)(in_RSI + (long)local_15c * 8) < 1) {
        local_188 = 0;
      }
      else {
        local_188 = *(long *)(in_RCX + (long)local_15c * 8) -
                    *(long *)(in_RSI + (long)local_15c * 8);
      }
      alStack_128[local_15c] = local_188;
      while( true ) {
        lVar1 = alStack_158[local_15c];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if (((*(long *)(in_RSI + (long)local_15c * 8) + alStack_128[local_15c]) -
            *(long *)(in_RCX + (long)local_15c * 8)) % lVar1 == 0) break;
        alStack_128[local_15c] = alStack_128[local_15c] + 1;
        if (alStack_98[local_15c] <= alStack_128[local_15c]) {
          return 0;
        }
      }
      if (0 < local_15c) {
        (&tl)[local_15c] = (&tl)[local_15c + -1] * (&tl)[local_15c];
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int imcomp_test_overlap (
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    long *ininc,        /* I - increment to be applied in each image dimen. */
    int *status)

/* 
  test if there are any intersecting pixels between this tile and the section
  of the image defined by fixel, lpixel, ininc. 
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    int ii;
    long tf, tl;

    if (*status > 0)
        return(*status);


    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(0);  /* there are no overlapping pixels */

        inc[ii] = ininc[ii];

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1) {
            *status = NEG_AXIS;
            return(0);
        }

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1) {
            *status = NEG_AXIS;
            return(0);
        }

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(0);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(0);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(0);  /* no overlapping pixels */
        }

        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    return(1);  /* there appears to be  intersecting pixels */
}